

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O1

void __thiscall WorkerStream::~WorkerStream(WorkerStream *this)

{
  WorkerFlow *this_00;
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = *(_Rb_tree_node_base **)&this->field_0x18;
      p_Var1 != (_Rb_tree_node_base *)&this->field_0x8;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (WorkerFlow *)**(undefined8 **)(p_Var1 + 2);
    if (this_00 != (WorkerFlow *)0x0) {
      WorkerFlow::~WorkerFlow(this_00);
      operator_delete(this_00,0x38);
    }
    if (*(void **)(p_Var1 + 2) != (void *)0x0) {
      operator_delete(*(void **)(p_Var1 + 2),0x10);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
               *)this);
  return;
}

Assistant:

WorkerStream::~WorkerStream()
{
    typedef std::map<std::string, WorkerWrapper*>::iterator it_type;

    for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
        delete it->second->flow;
        delete it->second;
    }
}